

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

bool __thiscall CLOParser::getBool(CLOParser *this,char *names,bool *result)

{
  CLOParser *this_00;
  bool bVar1;
  int iVar2;
  istream *piVar3;
  long *plVar4;
  bool bVar5;
  long *plVar6;
  bool bVar7;
  string keyword;
  string buffer;
  string negOptions;
  string longOptions;
  string shortOptions;
  istringstream iss;
  char *local_2a0;
  ulong local_298;
  char local_290 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  char *local_240;
  long local_238;
  char local_230 [16];
  bool *local_220;
  CLOParser *local_218;
  char *local_210;
  long local_208;
  char local_200 [16];
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_1f0 = local_1e0;
  local_1e8 = 0;
  local_1e0[0] = '\0';
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = '\0';
  local_240 = local_230;
  local_238 = 0;
  local_230[0] = '\0';
  std::__cxx11::string::string((string *)&local_2a0,names,(allocator *)&local_260);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_2a0,_S_in);
  local_220 = result;
  local_218 = this;
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  local_298 = 0;
  local_290[0] = '\0';
  local_2a0 = local_290;
  while( true ) {
    piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_2a0);
    this_00 = local_218;
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    if (local_298 < 3) {
      if (local_1e8 != 0) {
        std::__cxx11::string::append((char *)&local_1f0);
      }
      std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_2a0);
    }
    else {
      if (local_208 != 0) {
        std::__cxx11::string::append((char *)&local_210);
      }
      std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_2a0);
      if ((*local_2a0 == '-') && (local_2a0[1] == '-')) {
        if (local_238 != 0) {
          std::__cxx11::string::append((char *)&local_240);
        }
        std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_2a0);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0x1dc8fc);
        local_260 = &local_250;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_250 = *plVar6;
          lStack_248 = plVar4[3];
        }
        else {
          local_250 = *plVar6;
          local_260 = (long *)*plVar4;
        }
        local_258 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
        if (local_260 != &local_250) {
          operator_delete(local_260);
        }
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0]);
        }
      }
    }
  }
  bVar1 = getOption<int>(local_218,local_1f0,(int *)0x0,false);
  bVar7 = true;
  bVar5 = true;
  if (!bVar1) {
    bVar1 = getOption<int>(this_00,local_240,(int *)0x0,false);
    if (bVar1) goto LAB_001bd434;
    bVar1 = getOption<std::__cxx11::string>(this_00,local_210,&local_280,false);
    if (!bVar1) {
      bVar7 = false;
      goto LAB_001bd440;
    }
    bVar5 = true;
    if (local_280._M_string_length != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_280);
      bVar5 = true;
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)&local_280);
        bVar5 = true;
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_280);
          bVar5 = true;
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_280);
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)&local_280);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)&local_280);
                if (iVar2 != 0) {
                  *this_00->i = *this_00->i + -1;
                  bVar5 = true;
                  goto LAB_001bd436;
                }
              }
            }
LAB_001bd434:
            bVar5 = false;
          }
        }
      }
    }
  }
LAB_001bd436:
  *local_220 = bVar5;
LAB_001bd440:
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  return bVar7;
}

Assistant:

inline bool getBool(const char* names, bool& result) {
		std::string buffer;
		std::string shortOptions;
		std::string longOptions;
		std::string negOptions;
		std::istringstream iss(names);
		std::string keyword;
		while (iss >> keyword) {
			if (keyword.size() <= 2) {
				if (!shortOptions.empty()) {
					shortOptions += " ";
				}
				shortOptions += keyword;
			} else {
				if (!longOptions.empty()) {
					longOptions += " ";
				}
				longOptions += keyword;
				if (keyword[0] == '-' && keyword[1] == '-') {
					if (!negOptions.empty()) {
						negOptions += " ";
					}
					negOptions += "--no" + keyword.substr(1);
				}
			}
		}

		if (getOption(shortOptions.c_str())) {
			result = true;
			return true;
		}
		if (getOption(negOptions.c_str())) {
			result = false;
			return true;
		}

		if (getOption(longOptions.c_str(), &buffer)) {
			if (buffer.empty() || (buffer == "true" || buffer == "on" || buffer == "1")) {
				result = true;
			} else if (buffer == "false" || buffer == "off" || buffer == "0") {
				result = false;
			} else {
				--i;
				result = true;
			}
			return true;
		}
		return false;
	}